

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

void __thiscall CConnman::PushMessage(CConnman *this,CNode *pnode,CSerializedNetMsg *msg)

{
  _Head_base<0UL,_Transport_*,_false> _Var1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  int iVar5;
  Logger *this_00;
  undefined4 extraout_var;
  undefined8 uVar6;
  size_t sVar7;
  long in_FS_OFFSET;
  string_view source_file;
  pair<unsigned_long,_bool> pVar9;
  string_view logging_function;
  size_t nMessageSize;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock104;
  string local_50;
  long local_30;
  long lVar8;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  nMessageSize = (long)(msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  this_00 = LogInstance();
  bVar4 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
  if (bVar4) {
    local_50._M_dataplus._M_p = (pointer)pnode->id;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp";
    source_file._M_len = 0x57;
    logging_function._M_str = "PushMessage";
    logging_function._M_len = 0xb;
    LogPrintFormatInternal<std::__cxx11::string,unsigned_long,long>
              (logging_function,source_file,0xf02,NET,Debug,(ConstevalFormatString<3U>)0xf7a5f7,
               &msg->m_type,&nMessageSize,(long *)&local_50);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"-capturemessages","");
  bVar4 = ArgsManager::GetBoolArg(&gArgs,&local_50,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    local_50._M_dataplus._M_p =
         (pointer)(msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    local_50._M_string_length =
         (long)(msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
               .super__Vector_impl_data._M_finish - (long)local_50._M_dataplus._M_p;
    criticalblock104.super_unique_lock._M_device =
         (mutex_type *)((ulong)criticalblock104.super_unique_lock._M_device & 0xffffffffffffff00);
    if (CaptureMessage_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        uVar6 = std::__throw_bad_function_call();
        std::unique_lock<std::mutex>::~unique_lock(&criticalblock104.super_unique_lock);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          _Unwind_Resume(uVar6);
        }
      }
      goto LAB_008c7f42;
    }
    (*CaptureMessage_abi_cxx11_._M_invoker)
              ((_Any_data *)&CaptureMessage_abi_cxx11_,&pnode->addr,&msg->m_type,
               (Span<const_unsigned_char> *)&local_50,(bool *)&criticalblock104);
  }
  criticalblock104.super_unique_lock._M_device = &(pnode->cs_vSend).super_mutex;
  criticalblock104.super_unique_lock._M_owns = false;
  std::unique_lock<std::mutex>::lock(&criticalblock104.super_unique_lock);
  _Var1._M_head_impl =
       (pnode->m_transport)._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>.
       _M_t.super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
       super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
  (*(_Var1._M_head_impl)->_vptr_Transport[7])(&local_50,_Var1._M_head_impl,1);
  if (local_50.field_2._8_8_ == 0) {
    bVar4 = (pnode->vSendMsg).
            super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur ==
            (pnode->vSendMsg).
            super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  }
  else {
    bVar4 = false;
  }
  puVar2 = (msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  puVar3 = (msg->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = 0x38;
  if (puVar2 != puVar3) {
    lVar8 = ((ulong)(puVar2 + (0x1f - (long)puVar3)) & 0xfffffffffffffff0) + 0x38;
  }
  sVar7 = lVar8 + pnode->m_send_memusage;
  pnode->m_send_memusage = sVar7;
  iVar5 = (*((pnode->m_transport)._M_t.
             super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
             super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
             super__Head_base<0UL,_Transport_*,_false>._M_head_impl)->_vptr_Transport[9])();
  if ((ulong)this->nSendBufferMaxSize < CONCAT44(extraout_var,iVar5) + sVar7) {
    LOCK();
    (pnode->fPauseSend)._M_base._M_i = true;
    UNLOCK();
  }
  std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::emplace_back<CSerializedNetMsg>
            (&pnode->vSendMsg,msg);
  if ((bVar4) && ((char)local_50._M_string_length == '\x01')) {
    pVar9 = SocketSendData(this,pnode);
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock104.super_unique_lock);
    if (pVar9.first != 0) {
      RecordBytesSent(this,pVar9.first);
    }
  }
  else {
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock104.super_unique_lock);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_008c7f42:
  __stack_chk_fail();
}

Assistant:

void CConnman::PushMessage(CNode* pnode, CSerializedNetMsg&& msg)
{
    AssertLockNotHeld(m_total_bytes_sent_mutex);
    size_t nMessageSize = msg.data.size();
    LogDebug(BCLog::NET, "sending %s (%d bytes) peer=%d\n", msg.m_type, nMessageSize, pnode->GetId());
    if (gArgs.GetBoolArg("-capturemessages", false)) {
        CaptureMessage(pnode->addr, msg.m_type, msg.data, /*is_incoming=*/false);
    }

    TRACE6(net, outbound_message,
        pnode->GetId(),
        pnode->m_addr_name.c_str(),
        pnode->ConnectionTypeAsString().c_str(),
        msg.m_type.c_str(),
        msg.data.size(),
        msg.data.data()
    );

    size_t nBytesSent = 0;
    {
        LOCK(pnode->cs_vSend);
        // Check if the transport still has unsent bytes, and indicate to it that we're about to
        // give it a message to send.
        const auto& [to_send, more, _msg_type] =
            pnode->m_transport->GetBytesToSend(/*have_next_message=*/true);
        const bool queue_was_empty{to_send.empty() && pnode->vSendMsg.empty()};

        // Update memory usage of send buffer.
        pnode->m_send_memusage += msg.GetMemoryUsage();
        if (pnode->m_send_memusage + pnode->m_transport->GetSendMemoryUsage() > nSendBufferMaxSize) pnode->fPauseSend = true;
        // Move message to vSendMsg queue.
        pnode->vSendMsg.push_back(std::move(msg));

        // If there was nothing to send before, and there is now (predicted by the "more" value
        // returned by the GetBytesToSend call above), attempt "optimistic write":
        // because the poll/select loop may pause for SELECT_TIMEOUT_MILLISECONDS before actually
        // doing a send, try sending from the calling thread if the queue was empty before.
        // With a V1Transport, more will always be true here, because adding a message always
        // results in sendable bytes there, but with V2Transport this is not the case (it may
        // still be in the handshake).
        if (queue_was_empty && more) {
            std::tie(nBytesSent, std::ignore) = SocketSendData(*pnode);
        }
    }
    if (nBytesSent) RecordBytesSent(nBytesSent);
}